

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPifdef(TPpContext *this,int defined,TPpToken *ppToken)

{
  int atom;
  MacroSymbol *pMVar1;
  bool bVar2;
  MacroSymbol *macro;
  int token;
  TPpToken *ppToken_local;
  int defined_local;
  TPpContext *this_local;
  
  macro._4_4_ = scanToken(this,ppToken);
  if ((this->ifdepth < 0x42) && (this->elsetracker < 0x42)) {
    this->elsetracker = this->elsetracker + 1;
    this->ifdepth = this->ifdepth + 1;
    if (macro._4_4_ == 0xa2) {
      atom = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
      pMVar1 = lookupMacroDef(this,atom);
      macro._4_4_ = scanToken(this,ppToken);
      if (macro._4_4_ != 10) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,
                   "unexpected tokens following #ifdef directive - expected a newline","#ifdef","");
        while (macro._4_4_ != 10 && macro._4_4_ != -1) {
          macro._4_4_ = scanToken(this,ppToken);
        }
      }
      bVar2 = false;
      if (pMVar1 != (MacroSymbol *)0x0) {
        bVar2 = ((byte)pMVar1->field_0x48 >> 2 & 1) == 0;
      }
      if ((uint)bVar2 != defined) {
        macro._4_4_ = CPPelse(this,1,ppToken);
      }
    }
    else if (defined == 0) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must be followed by macro name","#ifndef","");
    }
    else {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must be followed by macro name","#ifdef","");
    }
    this_local._4_4_ = macro._4_4_;
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"maximum nesting depth exceeded","#ifdef","");
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPifdef(int defined, TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (ifdepth > maxIfNesting || elsetracker > maxIfNesting) {
        parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#ifdef", "");
        return EndOfInput;
    } else {
        elsetracker++;
        ifdepth++;
    }

    if (token != PpAtomIdentifier) {
        if (defined)
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifdef", "");
        else
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifndef", "");
    } else {
        MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
        token = scanToken(ppToken);
        if (token != '\n') {
            parseContext.ppError(ppToken->loc, "unexpected tokens following #ifdef directive - expected a newline", "#ifdef", "");
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);
        }
        if (((macro != nullptr && !macro->undef) ? 1 : 0) != defined)
            token = CPPelse(1, ppToken);
    }

    return token;
}